

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

void __thiscall rsg::ConstructorOp::~ConstructorOp(ConstructorOp *this)

{
  pointer ppEVar1;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__ConstructorOp_00c45998;
  for (ppEVar1 = (this->m_inputExpressions).
                 super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppEVar1 !=
      (this->m_inputExpressions).
      super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar1 = ppEVar1 + 1) {
    if (*ppEVar1 != (Expression *)0x0) {
      (*(*ppEVar1)->_vptr_Expression[1])();
    }
  }
  std::_Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>::~_Vector_base
            (&(this->m_inputExpressions).
              super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>);
  std::vector<rsg::ValueRange,_std::allocator<rsg::ValueRange>_>::~vector(&this->m_inputValueRanges)
  ;
  std::_Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>::~_Vector_base
            ((_Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_> *)&this->m_value);
  ValueRange::~ValueRange(&this->m_valueRange);
  return;
}

Assistant:

ConstructorOp::~ConstructorOp (void)
{
	for (vector<Expression*>::iterator i = m_inputExpressions.begin(); i != m_inputExpressions.end(); i++)
		delete *i;
}